

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_export_strings.hpp
# Opt level: O2

void add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
               (database *db,char **first,char **last,
               insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
               out)

{
  anon_class_24_3_5625b2a5 __unary_op;
  mock_mutex mutex;
  vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  views;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  name_index;
  indirect_string_adder adder;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&views,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,db,(unique_lock<mock_mutex> *)&views);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&views);
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)&name_index,db,true);
  views.
  super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  views.
  super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  views.
  super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  transform<char_const**,std::back_insert_iterator<std::vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>>,add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>(pstore::database&,char_const**,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>)::_lambda(char_const*)_1_>
            (first,last);
  adder.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  adder.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  adder.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __unary_op.transaction = &transaction;
  __unary_op.adder = &adder;
  __unary_op.name_index = &name_index;
  std::
  transform<__gnu_cxx::__normal_iterator<pstore::sstring_view<char_const*>*,std::vector<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>>,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>,add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>(pstore::database&,char_const**,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>)::_lambda(pstore::sstring_view<char_const*>const&)_1_>
            ((__normal_iterator<pstore::sstring_view<const_char_*>_*,_std::vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>_>
              )views.
               super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<pstore::sstring_view<const_char_*>_*,_std::vector<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>_>
              )views.
               super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,out,__unary_op);
  pstore::indirect_string_adder::flush(&adder,&transaction.super_transaction_base);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  std::
  _Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
                   *)&adder);
  std::
  _Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ::~_Vector_base(&views.
                   super__Vector_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
                 );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&name_index.
              super___shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  return;
}

Assistant:

void add_export_strings (pstore::database & db, InputIterator first, InputIterator last,
                         OutputIterator out) {
    mock_mutex mutex;
    auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
    auto const name_index = pstore::index::get_index<Index> (db);

    std::vector<pstore::raw_sstring_view> views;
    std::transform (first, last, std::back_inserter (views),
                    [] (pstore::gsl::czstring str) { return pstore::make_sstring_view (str); });

    using string_address = pstore::typed_address<pstore::indirect_string>;
    pstore::indirect_string_adder adder;
    std::transform (std::begin (views), std::end (views), out,
                    [&] (pstore::raw_sstring_view const & view) {
                        std::pair<pstore::index::name_index::iterator, bool> const res1 =
                            adder.add (transaction, name_index, &view);
                        return std::make_pair (view.to_string (),
                                               string_address::make (res1.first.get_address ()));
                    });

    adder.flush (transaction);
    transaction.commit ();
}